

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O1

void __thiscall
QEventDispatcherUNIX::registerTimer
          (QEventDispatcherUNIX *this,TimerId timerId,Duration interval,TimerType timerType,
          QObject *obj)

{
  QTimerInfoList::registerTimer
            ((QTimerInfoList *)(*(long *)(this + 8) + 0xd8),timerId,(Duration)interval.__r,timerType
             ,obj);
  return;
}

Assistant:

void QEventDispatcherUNIX::registerTimer(Qt::TimerId timerId, Duration interval, Qt::TimerType timerType, QObject *obj)
{
#ifndef QT_NO_DEBUG
    if (qToUnderlying(timerId) < 1 || interval.count() < 0 || !obj) {
        qWarning("QEventDispatcherUNIX::registerTimer: invalid arguments");
        return;
    } else if (obj->thread() != thread() || thread() != QThread::currentThread()) {
        qWarning("QEventDispatcherUNIX::registerTimer: timers cannot be started from another thread");
        return;
    }
#endif

    Q_D(QEventDispatcherUNIX);
    d->timerList.registerTimer(timerId, interval, timerType, obj);
}